

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abin.c
# Opt level: O3

atomBins * initBins(char serialNum,region *boundingBox,float delta)

{
  atomBins *b;
  atomPtr ***__ptr;
  atomPtr **__ptr_00;
  atomPtr *__ptr_01;
  undefined4 extraout_EDX;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  double dVar6;
  undefined1 auVar8 [16];
  double dVar7;
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar12;
  undefined1 auVar11 [16];
  
  if (delta < 0.1) {
    delta = 5.0;
  }
  auVar11._0_8_ = (double)delta;
  dVar6 = floor(((boundingBox->max).x - (boundingBox->min).x) / auVar11._0_8_ + 1.0);
  uVar5 = (uint)(dVar6 + 2.0);
  auVar8._0_8_ = (boundingBox->max).y - (boundingBox->min).y;
  auVar8._8_8_ = (boundingBox->max).z - (boundingBox->min).z;
  auVar11._8_8_ = auVar11._0_8_;
  auVar8 = divpd(auVar8,auVar11);
  dVar6 = floor(auVar8._0_8_ + 1.0);
  dVar7 = floor(auVar8._8_8_ + 1.0);
  uVar10 = (uint)(dVar6 + 2.0);
  uVar12 = (uint)(dVar7 + 2.0);
  b = (atomBins *)malloc(0x68);
  b->delta = delta;
  dVar6 = (boundingBox->min).y;
  (b->min).x = (boundingBox->min).x;
  (b->min).y = dVar6;
  (b->min).z = (boundingBox->min).z;
  dVar6 = (boundingBox->max).y;
  (b->max).x = (boundingBox->max).x;
  (b->max).y = dVar6;
  (b->max).z = (boundingBox->max).z;
  v3sub(&b->max,(vector3d *)b,&b->sz);
  b->nx = uVar5;
  b->ny = uVar10;
  b->nz = uVar12;
  b->binSerialNum = serialNum;
  __ptr = (atomPtr ***)malloc((long)(int)uVar5 << 3);
  __ptr_00 = (atomPtr **)malloc((long)(int)(uVar10 * uVar5) << 3);
  __ptr_01 = (atomPtr *)malloc((long)(int)(uVar10 * uVar5 * uVar12) << 3);
  if ((((b == (atomBins *)0x0) || (__ptr == (atomPtr ***)0x0)) || (__ptr_00 == (atomPtr **)0x0)) ||
     (__ptr_01 == (atomPtr *)0x0)) {
    warn("could not create atom bins");
    free(b);
    if (__ptr != (atomPtr ***)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (atomPtr **)0x0) {
      free(__ptr_00);
    }
    if (__ptr_01 != (atomPtr *)0x0) {
      free(__ptr_01);
    }
    b = (atomBins *)0x0;
  }
  else {
    b->list = __ptr;
    if (0 < (int)uVar5) {
      auVar9._0_4_ = -(uint)(0 < (int)uVar10);
      auVar9._4_4_ = -(uint)(0 < (int)uVar10);
      auVar9._8_4_ = -(uint)(0 < (int)uVar12);
      auVar9._12_4_ = -(uint)(0 < (int)uVar12);
      uVar1 = movmskpd(extraout_EDX,auVar9);
      uVar2 = 0;
      do {
        b->list[uVar2] = __ptr_00;
        if ((uVar1 & 1) != 0) {
          uVar3 = 0;
          do {
            b->list[uVar2][uVar3] = __ptr_01;
            if ((byte)((byte)uVar1 >> 1) != 0) {
              uVar4 = 0;
              do {
                b->list[uVar2][uVar3][uVar4] = (atomPtr)0x0;
                uVar4 = uVar4 + 1;
              } while (uVar12 != uVar4);
            }
            __ptr_01 = __ptr_01 + (int)uVar12;
            uVar3 = uVar3 + 1;
          } while (uVar3 != uVar10);
        }
        __ptr_00 = __ptr_00 + (int)uVar10;
        uVar2 = uVar2 + 1;
      } while (uVar2 != uVar5);
    }
  }
  return b;
}

Assistant:

atomBins* initBins(char serialNum, region *boundingBox, float delta) {
	atomBins *bp;
	int i, j, k, nx, ny, nz;
	int n1, n2, n3;
	atomPtr ***b1, **b2, *b3;

	if (delta < 0.1) delta = 5.0;

	nx = OFFSET(boundingBox->max.x, boundingBox->min.x, delta) + 2;
	ny = OFFSET(boundingBox->max.y, boundingBox->min.y, delta) + 2;
	nz = OFFSET(boundingBox->max.z, boundingBox->min.z, delta) + 2;

	bp = (atomBins *)malloc(sizeof(atomBins));

	bp->delta = delta;

	bp->min = boundingBox->min;
	bp->max = boundingBox->max;
	v3sub(&(bp->max), &(bp->min), &(bp->sz));
	bp->nx = nx;
	bp->ny = ny;
	bp->nz = nz;
	bp->binSerialNum = serialNum;

	n1 = nx;
	n2 = nx*ny;
	n3 = nx*ny*nz;

	b1 = (atomPtr ***)malloc(sizeof(atomPtr **)*n1);
	b2 = (atomPtr  **)malloc(sizeof(atomPtr  *)*n2);
	b3 = (atomPtr   *)malloc(sizeof(atomPtr   )*n3);
	if (!bp || !b1 || !b2 || !b3) {
		warn("could not create atom bins");
		if (bp) free(bp);
		if (b1) free(b1);
		if (b2) free(b2);
		if (b3) free(b3);
		return NULL;
	}

	bp->list = b1;

	for(i = 0; i < nx; i++) {
		bp->list[i] = b2; b2 += ny;

		for(j = 0; j < ny; j++) {
			bp->list[i][j] = b3; b3 += nz;

			for(k = 0; k < nz; k++) {
				bp->list[i][j][k] = 0;
			}
		}
	}

	return bp;
}